

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O0

size_t object_desc(char *buf,size_t max,object *obj,uint32_t mode,player *p)

{
  short sVar1;
  char *pcVar2;
  _Bool _Var3;
  size_t sVar4;
  char *pcVar5;
  bool prefix_00;
  bool bVar6;
  char *local_48;
  size_t end;
  _Bool terse;
  _Bool spoil;
  _Bool prefix;
  player *p_local;
  uint32_t mode_local;
  object *obj_local;
  size_t max_local;
  char *buf_local;
  
  prefix_00 = (mode & 0x40) != 0;
  bVar6 = (mode & 0x20) == 0;
  if ((obj == (object *)0x0) || (obj->known == (object *)0x0)) {
    buf_local = (char *)strnfmt(buf,max,"(nothing)");
  }
  else if ((obj->known == (object *)0x0) || (obj->kind == obj->known->kind)) {
    _Var3 = tval_is_money(obj);
    if (_Var3) {
      sVar1 = obj->pval;
      pcVar2 = obj->kind->name;
      _Var3 = ignore_item_ok(p,obj);
      pcVar5 = "";
      if (_Var3) {
        pcVar5 = " {ignore}";
      }
      buf_local = (char *)strnfmt(buf,max,"%d gold pieces worth of %s%s",(ulong)(uint)(int)sVar1,
                                  pcVar2,pcVar5);
    }
    else {
      if ((obj->known->ego != (ego_item *)0x0) && (bVar6)) {
        obj->ego->everseen = true;
      }
      _Var3 = object_flavor_is_aware(obj);
      if ((_Var3) && (bVar6)) {
        obj->kind->everseen = true;
      }
      local_48 = (char *)obj_desc_name(buf,max,0,obj,prefix_00,mode,(mode & 0x100) != 0,p);
      if ((mode & 1) != 0) {
        _Var3 = tval_is_chest(obj);
        if (_Var3) {
          local_48 = (char *)obj_desc_chest(obj,buf,max,(size_t)local_48);
        }
        else {
          _Var3 = tval_is_light(obj);
          if (_Var3) {
            local_48 = (char *)obj_desc_light(obj,buf,max,(size_t)local_48);
          }
        }
        local_48 = (char *)obj_desc_combat(obj->known,buf,max,(size_t)local_48,mode,p);
      }
      if ((mode & 2) != 0) {
        sVar4 = obj_desc_mods(obj->known,buf,max,(size_t)local_48);
        sVar4 = obj_desc_charges(obj,buf,max,sVar4,mode);
        if ((mode & 4) == 0) {
          local_48 = (char *)obj_desc_inscrip(obj,buf,max,sVar4,p);
        }
        else {
          local_48 = (char *)obj_desc_aware(obj,buf,max,sVar4);
        }
      }
      buf_local = local_48;
    }
  }
  else if (prefix_00) {
    buf_local = (char *)strnfmt(buf,max,"an unknown item");
  }
  else {
    buf_local = (char *)strnfmt(buf,max,"unknown item");
  }
  return (size_t)buf_local;
}

Assistant:

size_t object_desc(char *buf, size_t max, const struct object *obj,
		uint32_t mode, const struct player *p)
{
	bool prefix = mode & ODESC_PREFIX ? true : false;
	bool spoil = mode & ODESC_SPOIL ? true : false;
	bool terse = mode & ODESC_TERSE ? true : false;

	size_t end = 0;

	/* Simple description for null item */
	if (!obj || !obj->known)
		return strnfmt(buf, max, "(nothing)");

	/* Unknown itema and cash get straightforward descriptions */
	if (obj->known && obj->kind != obj->known->kind) {
		if (prefix)
			return strnfmt(buf, max, "an unknown item");
		return strnfmt(buf, max, "unknown item");
	}

	if (tval_is_money(obj))
		return strnfmt(buf, max, "%d gold pieces worth of %s%s",
				obj->pval, obj->kind->name,
				ignore_item_ok(p, obj) ? " {ignore}" : "");

	/* Egos and kinds whose name we know are seen */
	if (obj->known->ego && !spoil)
		obj->ego->everseen = true;

	if (object_flavor_is_aware(obj) && !spoil)
		obj->kind->everseen = true;

	/** Construct the name **/

	/* Copy the base name to the buffer */
	end = obj_desc_name(buf, max, end, obj, prefix, mode, terse, p);

	/* Combat properties */
	if (mode & ODESC_COMBAT) {
		if (tval_is_chest(obj))
			end = obj_desc_chest(obj, buf, max, end);
		else if (tval_is_light(obj))
			end = obj_desc_light(obj, buf, max, end);

		end = obj_desc_combat(obj->known, buf, max, end, mode, p);
	}

	/* Modifiers, charges, flavour details, inscriptions */
	if (mode & ODESC_EXTRA) {
		end = obj_desc_mods(obj->known, buf, max, end);

		end = obj_desc_charges(obj, buf, max, end, mode);

		if (mode & ODESC_STORE)
			end = obj_desc_aware(obj, buf, max, end);
		else
			end = obj_desc_inscrip(obj, buf, max, end, p);
	}

	return end;
}